

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_text.c
# Opt level: O1

void gatom_key(void *z,t_symbol *keysym,t_floatarg f)

{
  int iVar1;
  t_atom *ptVar2;
  _rtext *x;
  t_symbol *ptVar3;
  long lVar4;
  int iVar5;
  double dVar6;
  int bufsize;
  char *buf;
  int local_3c;
  char *local_38;
  
  iVar5 = (int)f;
  ptVar2 = gatom_getatom((t_gatom *)z);
  x = glist_findrtext(*(_glist **)((long)z + 0x38),(t_text *)z);
  if (iVar5 == 10) {
    *(byte *)((long)z + 0x78) = *(byte *)((long)z + 0x78) & 0xef;
    if (x == *(_rtext **)(*(long *)(*(long *)((long)z + 0x38) + 0xc0) + 0x28)) {
      rtext_gettext(x,&local_38,&local_3c);
      ptVar3 = gensym("End");
      lVar4 = 0;
      rtext_key(x,0,ptVar3);
      do {
        if (local_38[local_3c + -1 + (int)lVar4] != '.') {
          iVar5 = -(int)lVar4;
          goto joined_r0x0015f5ec;
        }
        lVar4 = lVar4 + -1;
      } while (lVar4 != -3);
      iVar5 = 3;
joined_r0x0015f5ec:
      for (; iVar5 != 0; iVar5 = iVar5 + -1) {
        rtext_key(x,8,&s_);
      }
      rtext_gettext(x,&local_38,&local_3c);
      if (*(int *)((long)z + 0x30) == 2) {
        ptVar3 = gensym(local_38);
        (ptVar2->a_w).w_symbol = ptVar3;
      }
      else if (*(int *)((long)z + 0x30) == 1) {
        dVar6 = atof(local_38);
        (ptVar2->a_w).w_float = (float)dVar6;
      }
      else {
        text_setto((t_text *)z,*(_glist **)((long)z + 0x38),local_38,local_3c);
      }
      rtext_activate(x,0);
    }
    gatom_bang((t_gatom *)z);
    gatom_senditup((t_gatom *)z);
  }
  else if ((iVar5 == 0) && ((*(byte *)((long)z + 0x78) & 0x10) == 0)) {
    if (x == *(_rtext **)(*(long *)(*(long *)((long)z + 0x38) + 0xc0) + 0x28)) {
      rtext_activate(x,0);
    }
    *(byte *)((long)z + 0x78) = *(byte *)((long)z + 0x78) & 0xf7;
    gatom_reborder((t_gatom *)z);
    if ((*(_glist **)((long)z + 0x38))->gl_editor != (t_editor *)0x0) {
      glist_retext(*(_glist **)((long)z + 0x38),(t_text *)z);
      return;
    }
  }
  else {
    if (x != *(_rtext **)(*(long *)(*(long *)((long)z + 0x38) + 0xc0) + 0x28)) {
      rtext_activate(x,1);
      rtext_key(x,0x2e,&s_);
      rtext_key(x,0x2e,&s_);
      rtext_key(x,0x2e,&s_);
      ptVar3 = gensym("Home");
      rtext_key(x,0,ptVar3);
    }
    iVar1 = *(int *)((long)z + 0x30);
    if (iVar1 == 2) {
LAB_0015f5cc:
      rtext_key(x,iVar5,keysym);
      return;
    }
    if (iVar1 == 1) {
      if ((iVar5 - 0x30U < 10) ||
         (((iVar5 - 0x2bU < 0x3b &&
           ((0x40000000400000dU >> ((ulong)(iVar5 - 0x2bU) & 0x3f) & 1) != 0)) || (iVar5 == 8))))
      goto LAB_0015f5cc;
    }
    else if (iVar1 == 0) goto LAB_0015f5cc;
  }
  return;
}

Assistant:

void gatom_key(void *z, t_symbol *keysym, t_floatarg f)
{
    t_gatom *x = (t_gatom *)z;
    int c = f, bufsize, i;
    char *buf;
    t_atom *ap = gatom_getatom(x);

    t_rtext *t = glist_findrtext(x->a_glist, &x->a_text);
    if (c == 0 && !x->a_doubleclicked)
    {
        /* we're being notified that no more keys will come for this grab */
        if (t == x->a_glist->gl_editor->e_textedfor)
            rtext_activate(t, 0);
        x->a_grabbed = 0;
        gatom_reborder(x);
        gatom_redraw(&x->a_text.te_g, x->a_glist);
    }
    else if (c == '\n')
    {
        x->a_doubleclicked = 0;
        if (t == x->a_glist->gl_editor->e_textedfor)
        {
            rtext_gettext(t, &buf, &bufsize);
            rtext_key(t, 0, gensym("End"));
            for (i = 0; i < 3; i++)
                if (buf[bufsize-i-1] != '.')
                    break;
            while (i--)
                rtext_key(t, '\b', &s_);
            rtext_gettext(t, &buf, &bufsize);
            if (x->a_flavor == A_FLOAT)
                ap->a_w.w_float = atof(buf);
            else if (x->a_flavor == A_SYMBOL)
                ap->a_w.w_symbol = gensym(buf);
            else
                text_setto(&x->a_text, x->a_glist, buf, bufsize);
            rtext_activate(t, 0);
        }
        gatom_bang(x);
        gatom_senditup(x);
    }
    else
    {
        if (t != x->a_glist->gl_editor->e_textedfor)
        {
            rtext_activate(t, 1);
            rtext_key(t, '.', &s_);
            rtext_key(t, '.', &s_);
            rtext_key(t, '.', &s_);
            rtext_key(t, 0, gensym("Home"));
        }
        if (x->a_flavor == A_SYMBOL || x->a_flavor == A_LIST)
            rtext_key(t, c, keysym);  /* insert the character */
        else if (x->a_flavor == A_FLOAT && ((c >= '0' && c <= '9') || c == '.' ||
            c == '-' || c == '+' || c == 'e' || c == 'E' || c == '\b'))
                rtext_key(t, c, keysym);  /* insert the accepted characters */
    }
}